

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O3

bool __thiscall
axl::sys::NameableEventBase<axl::sl::False>::create(NameableEventBase<axl::sl::False> *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  this->m_event = (EventImpl *)&this->field_3;
  pthread_cond_init((pthread_cond_t *)&this->field_3,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)((long)&this->field_3 + 0x30),(pthread_mutexattr_t *)0x0);
  (this->field_3).m_unnamedEventBuffer[0x58] = '\0';
  return true;
}

Assistant:

bool
	create() {
		close();

		m_event = (EventImpl*)m_unnamedEventBuffer;
		new(m_event) EventImpl;
		return true;
	}